

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5HashScanInit(Fts5Hash *p,char *pTerm,int nTerm)

{
  undefined8 *puVar1;
  Fts5HashEntry *pRight;
  int iVar2;
  undefined8 *__s;
  Fts5HashEntry *pLeft;
  Fts5HashEntry *pFVar3;
  long lVar4;
  undefined8 *puVar5;
  
  p->pScan = (Fts5HashEntry *)0x0;
  iVar2 = sqlite3_initialize();
  if (iVar2 == 0) {
    __s = (undefined8 *)sqlite3Malloc(0x100);
  }
  else {
    __s = (undefined8 *)0x0;
  }
  if (__s == (undefined8 *)0x0) {
    iVar2 = 7;
  }
  else {
    memset(__s,0,0x100);
    if (0 < p->nSlot) {
      lVar4 = 0;
      do {
        for (pFVar3 = p->aSlot[lVar4]; pFVar3 != (Fts5HashEntry *)0x0; pFVar3 = pFVar3->pHashNext) {
          if ((pTerm == (char *)0x0) ||
             ((nTerm <= pFVar3->nKey && (iVar2 = bcmp(pFVar3 + 1,pTerm,(long)nTerm), iVar2 == 0))))
          {
            pFVar3->pScanNext = (Fts5HashEntry *)0x0;
            pRight = (Fts5HashEntry *)*__s;
            pLeft = pFVar3;
            puVar5 = __s;
            while (pRight != (Fts5HashEntry *)0x0) {
              pLeft = fts5HashEntryMerge(pLeft,pRight);
              *puVar5 = 0;
              puVar1 = puVar5 + 1;
              puVar5 = puVar5 + 1;
              pRight = (Fts5HashEntry *)*puVar1;
            }
            *puVar5 = pLeft;
          }
        }
        lVar4 = lVar4 + 1;
      } while (lVar4 < p->nSlot);
    }
    lVar4 = 0;
    pFVar3 = (Fts5HashEntry *)0x0;
    do {
      pFVar3 = fts5HashEntryMerge(pFVar3,(Fts5HashEntry *)__s[lVar4]);
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x20);
    sqlite3_free(__s);
    p->pScan = pFVar3;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int sqlite3Fts5HashScanInit(
  Fts5Hash *p,                    /* Hash table to query */
  const char *pTerm, int nTerm    /* Query prefix */
){
  return fts5HashEntrySort(p, pTerm, nTerm, &p->pScan);
}